

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O1

void __thiscall
QPDFJob::doProcess(QPDFJob *this,unique_ptr<QPDF,_std::default_delete<QPDF>_> *pdf,
                  function<void_(QPDF_*,_const_char_*)> *fn,char *password,bool empty,
                  bool used_for_input,bool main_input)

{
  element_type *peVar1;
  logic_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *iter;
  _Alloc_hider _Var2;
  vector<const_char_*,_std::allocator<const_char_*>_> passwords;
  string ptemp;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  passwords_str;
  char *local_148;
  undefined4 local_13c;
  string local_138;
  function<void_(QPDF_*,_const_char_*)> *local_110;
  char *local_100;
  char *local_f8;
  undefined8 local_f0;
  char local_e8;
  undefined7 uStack_e7;
  string local_d8 [2];
  unique_ptr<QPDF,_std::default_delete<QPDF>_> *local_98;
  string local_90;
  _Any_data local_70;
  code *local_60;
  _Any_data local_50;
  code *local_40;
  
  local_f8 = &local_e8;
  local_f0 = 0;
  local_e8 = '\0';
  local_148 = password;
  if (((password != (char *)0x0) &&
      (peVar1 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
      peVar1->password_is_hex_key == false)) && (peVar1->password_mode == pm_hex_bytes)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_138,password,(allocator<char> *)&local_100);
    local_110 = fn;
    QUtil::hex_decode(local_d8,&local_138);
    std::__cxx11::string::operator=((string *)&local_f8,(string *)local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8[0]._M_dataplus._M_p != &local_d8[0].field_2) {
      operator_delete(local_d8[0]._M_dataplus._M_p,local_d8[0].field_2._M_allocated_capacity + 1);
    }
    fn = local_110;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
    local_148 = local_f8;
  }
  if (((local_148 == (char *)0x0 || empty) ||
      (peVar1 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
      peVar1->password_is_hex_key != false)) || (peVar1->suppress_password_recovery == true)) {
    std::function<void_(QPDF_*,_const_char_*)>::function
              ((function<void_(QPDF_*,_const_char_*)> *)&local_70,fn);
    doProcessOnce(this,pdf,(function<void_(QPDF_*,_const_char_*)> *)&local_70,local_148,empty,
                  used_for_input,main_input);
    if (local_60 != (code *)0x0) {
      (*local_60)(&local_70,&local_70,__destroy_functor);
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,local_148,(allocator<char> *)&local_138);
    QUtil::possible_repaired_encodings
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_d8,&local_90);
    local_110 = fn;
    local_98 = pdf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    local_138._M_dataplus._M_p = (pointer)0x0;
    local_138._M_string_length = 0;
    local_138.field_2._M_allocated_capacity = 0;
    if (local_d8[0]._M_dataplus._M_p != (pointer)local_d8[0]._M_string_length) {
      _Var2._M_p = local_d8[0]._M_dataplus._M_p;
      do {
        local_100 = *(char **)_Var2._M_p;
        std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                  ((vector<char_const*,std::allocator<char_const*>> *)&local_138,&local_100);
        _Var2._M_p = _Var2._M_p + 0x20;
      } while (_Var2._M_p != (pointer)local_d8[0]._M_string_length);
    }
    if (8 < local_138._M_string_length - (long)local_138._M_dataplus._M_p) {
      if (local_138._M_string_length == local_138.field_2._M_allocated_capacity) {
        std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*const&>
                  ((vector<char_const*,std::allocator<char_const*>> *)&local_138,
                   (iterator)local_138._M_string_length,&local_148);
      }
      else {
        *(char **)local_138._M_string_length = local_148;
        local_138._M_string_length = local_138._M_string_length + 8;
      }
    }
    _Var2._M_p = local_138._M_dataplus._M_p;
    if (local_138._M_dataplus._M_p == (pointer)local_138._M_string_length) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(this_00,"do_process returned");
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    local_13c = 0;
    std::function<void_(QPDF_*,_const_char_*)>::function
              ((function<void_(QPDF_*,_const_char_*)> *)&local_50,local_110);
    doProcessOnce(this,local_98,(function<void_(QPDF_*,_const_char_*)> *)&local_50,
                  *(char **)_Var2._M_p,false,used_for_input,main_input);
    if (local_40 != (code *)0x0) {
      (*local_40)(&local_50,&local_50,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_138._M_dataplus._M_p,
                      local_138.field_2._M_allocated_capacity - (long)local_138._M_dataplus._M_p);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_d8);
  }
  if (local_f8 != &local_e8) {
    operator_delete(local_f8,CONCAT71(uStack_e7,local_e8) + 1);
  }
  return;
}

Assistant:

void
QPDFJob::doProcess(
    std::unique_ptr<QPDF>& pdf,
    std::function<void(QPDF*, char const*)> fn,
    char const* password,
    bool empty,
    bool used_for_input,
    bool main_input)
{
    // If a password has been specified but doesn't work, try other passwords that are equivalent in
    // different character encodings. This makes it possible to open PDF files that were encrypted
    // using incorrect string encodings. For example, if someone used a password encoded in PDF Doc
    // encoding or Windows code page 1252 for an AES-encrypted file or a UTF-8-encoded password on
    // an RC4-encrypted file, or if the password was properly encoded but the password given here
    // was incorrectly encoded, there's a good chance we'd succeed here.

    std::string ptemp;
    if (password && (!m->password_is_hex_key)) {
        if (m->password_mode == QPDFJob::pm_hex_bytes) {
            // Special case: handle --password-mode=hex-bytes for input password as well as output
            // password
            QTC::TC("qpdf", "QPDFJob input password hex-bytes");
            ptemp = QUtil::hex_decode(password);
            password = ptemp.c_str();
        }
    }
    if ((password == nullptr) || empty || m->password_is_hex_key || m->suppress_password_recovery) {
        // There is no password, or we're not doing recovery, so just do the normal processing with
        // the supplied password.
        doProcessOnce(pdf, fn, password, empty, used_for_input, main_input);
        return;
    }

    // Get a list of otherwise encoded strings. Keep in scope for this method.
    std::vector<std::string> passwords_str = QUtil::possible_repaired_encodings(password);
    // Represent to char const*, as required by the QPDF class.
    std::vector<char const*> passwords;
    for (auto const& iter: passwords_str) {
        passwords.push_back(iter.c_str());
    }
    // We always try the supplied password first because it is the first string returned by
    // possible_repaired_encodings. If there is more than one option, go ahead and put the supplied
    // password at the end so that it's that decoding attempt whose exception is thrown.
    if (passwords.size() > 1) {
        passwords.push_back(password);
    }

    // Try each password. If one works, return the resulting object. If they all fail, throw the
    // exception thrown by the final attempt, which, like the first attempt, will be with the
    // supplied password.
    bool warned = false;
    for (auto iter = passwords.begin(); iter != passwords.end(); ++iter) {
        try {
            doProcessOnce(pdf, fn, *iter, empty, used_for_input, main_input);
            return;
        } catch (QPDFExc&) {
            auto next = iter;
            ++next;
            if (next == passwords.end()) {
                throw;
            }
        }
        if (!warned) {
            warned = true;
            doIfVerbose([&](Pipeline& v, std::string const& prefix) {
                v << prefix
                  << ": supplied password didn't work; trying other passwords based on "
                     "interpreting password with different string encodings\n";
            });
        }
    }
    // Should not be reachable
    throw std::logic_error("do_process returned");
}